

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InstrumentPass::MovePostludeCode
          (InstrumentPass *this,UptrVectorIterator<spvtools::opt::BasicBlock,_false> ref_block_itr,
          BasicBlock *new_blk_ptr)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  uint32_t uVar4;
  mapped_type *pmVar5;
  Instruction *this_00;
  uint32_t rid;
  uint32_t local_4c;
  BasicBlock *local_48;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *local_40;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_38;
  
  pBVar1 = ((ref_block_itr.iterator_._M_current._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  this_00 = *(Instruction **)
             ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  if (this_00 !=
      (Instruction *)((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
  {
    local_40 = &this->same_block_pre_;
    local_48 = new_blk_ptr;
    do {
      if ((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xca,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar2 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar2 == (Instruction *)0x0) {
        __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xcc,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar3 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar3;
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
      (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0
      ;
      (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
      local_38._M_head_impl = this_00;
      if ((this->same_block_pre_)._M_h._M_element_count != 0) {
        CloneSameBlockOps(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_38,&this->same_block_post_,local_40,local_48);
        if ((this_00->opcode_ == OpImage) || (this_00->opcode_ == OpSampledImage)) {
          uVar4 = 0;
          if (this_00->has_result_id_ == true) {
            uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
          }
          local_4c = uVar4;
          pmVar5 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->same_block_post_,&local_4c);
          *pmVar5 = uVar4;
        }
      }
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(new_blk_ptr->insts_).super_IntrusiveList<spvtools::opt::Instruction>,this_00);
      pBVar1 = ((ref_block_itr.iterator_._M_current._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      this_00 = *(Instruction **)
                 ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    } while (this_00 !=
             (Instruction *)
             ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U));
  }
  return;
}

Assistant:

void InstrumentPass::MovePostludeCode(
    UptrVectorIterator<BasicBlock> ref_block_itr, BasicBlock* new_blk_ptr) {
  // Move contents of original ref block.
  for (auto cii = ref_block_itr->begin(); cii != ref_block_itr->end();
       cii = ref_block_itr->begin()) {
    Instruction* inst = &*cii;
    inst->RemoveFromList();
    std::unique_ptr<Instruction> mv_inst(inst);
    // Regenerate any same-block instruction that has not been seen in the
    // current block.
    if (same_block_pre_.size() > 0) {
      CloneSameBlockOps(&mv_inst, &same_block_post_, &same_block_pre_,
                        new_blk_ptr);
      // Remember same-block ops in this block.
      if (IsSameBlockOp(&*mv_inst)) {
        const uint32_t rid = mv_inst->result_id();
        same_block_post_[rid] = rid;
      }
    }
    new_blk_ptr->AddInstruction(std::move(mv_inst));
  }
}